

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedCols(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int *perm)

{
  uint uVar1;
  uint uVar2;
  Status *pSVar3;
  ulong uVar4;
  
  uVar1 = (this->thedesc).colstat.thesize;
  if (this->theLP->theRep == COLUMN) {
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        if ((long)perm[uVar4] < 0) {
          if ((0 < this->theLP->theRep * (this->thedesc).colstat.data[uVar4]) &&
             (this->thestatus != NO_PROBLEM)) {
            this->thestatus = NO_PROBLEM;
            invalidate(this);
          }
        }
        else {
          pSVar3 = (this->thedesc).colstat.data;
          pSVar3[perm[uVar4]] = pSVar3[uVar4];
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  else {
    this->matrixIsSetup = false;
    this->factorized = false;
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        uVar2 = perm[uVar4];
        if (uVar4 != uVar2) {
          if ((int)uVar2 < 0) {
            if ((this->theLP->theRep * (this->thedesc).colstat.data[uVar4] < 1) &&
               (this->thestatus != NO_PROBLEM)) {
              this->thestatus = NO_PROBLEM;
              invalidate(this);
            }
          }
          else {
            pSVar3 = (this->thedesc).colstat.data;
            pSVar3[uVar2] = pSVar3[uVar4];
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  reDim(this);
  return;
}

Assistant:

void SPxBasisBase<R>::removedCols(const int perm[])
{
   assert(status() > NO_PROBLEM);
   assert(theLP != nullptr);

   int i;
   int n = thedesc.nCols();

   if(theLP->rep() == SPxSolverBase<R>::COLUMN)
   {
      for(i = 0; i < n; ++i)
      {
         if(perm[i] < 0)            // column got removed
         {
            if(theLP->isBasic(thedesc.colStatus(i)))
               setStatus(NO_PROBLEM);
         }
         else                        // column was potentially moved
            thedesc.colStatus(perm[i]) = thedesc.colStatus(i);
      }
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::ROW);
      factorized = matrixIsSetup = false;

      for(i = 0; i < n; ++i)
      {
         if(perm[i] != i)
         {
            if(perm[i] < 0)                // column got removed
            {
               if(!theLP->isBasic(thedesc.colStatus(i)))
                  setStatus(NO_PROBLEM);
            }
            else                            // column was moved
               thedesc.colStatus(perm[i]) = thedesc.colStatus(i);
         }
      }
   }

   reDim();
}